

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O1

Aig_Obj_t * Saig_ManRetimeNodeFwd(Aig_Man_t *p,Aig_Obj_t *pObj,int fMakeBug)

{
  int iVar1;
  void **ppvVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  Aig_Obj_t *pAVar10;
  
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x34,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x35,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  piVar6 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  if (((uint)*(undefined8 *)(piVar6 + 6) & 7) == 2) {
    piVar7 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (((uint)*(undefined8 *)(piVar7 + 6) & 7) != 2) {
      return (Aig_Obj_t *)0x0;
    }
    if (*piVar6 < p->nTruePis) {
      return (Aig_Obj_t *)0x0;
    }
    if (p->nTruePis <= *piVar7) {
      if (*piVar6 < 1) {
        __assert_fail("Aig_ObjCioId(pFanin0) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                      ,0x41,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
      }
      if (*piVar7 < 1) {
        __assert_fail("Aig_ObjCioId(pFanin1) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                      ,0x42,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
      }
      if ((piVar6[8] == p->nTravIds) || (piVar7[8] == p->nTravIds)) {
        uVar4 = (*piVar6 - p->nTruePis) + p->nTruePos;
        if (-1 < (int)uVar4) {
          iVar1 = p->vCos->nSize;
          if ((((int)uVar4 < iVar1) &&
              (uVar5 = p->nTruePos + (*piVar7 - p->nTruePis), -1 < (int)uVar5)) &&
             ((int)uVar5 < iVar1)) {
            ppvVar2 = p->vCos->pArray;
            uVar8 = (uint)pObj->pFanin0;
            uVar3 = *(ulong *)((long)ppvVar2[uVar4] + 8);
            uVar4 = (uint)pObj->pFanin1 & 1;
            pAVar10 = (Aig_Obj_t *)(*(ulong *)((long)ppvVar2[uVar5] + 8) ^ (ulong)uVar4);
            if (fMakeBug != 0) {
              puts("Introducing bug during retiming.");
              pAVar10 = (Aig_Obj_t *)((ulong)pAVar10 ^ 1);
            }
            uVar9 = (ulong)(uVar8 & uVar4);
            pAVar10 = Aig_And(p,(Aig_Obj_t *)(uVar8 & 1 ^ uVar3),pAVar10);
            pAVar10 = Aig_ObjCreateCo(p,(Aig_Obj_t *)((ulong)pAVar10 ^ uVar9));
            (pAVar10->field_0).CioId = p->nObjs[3] + -1;
            pAVar10 = Aig_ObjCreateCi(p);
            (pAVar10->field_0).CioId = p->nObjs[2] + -1;
            p->nRegs = p->nRegs + 1;
            pAVar10->TravId = p->nTravIds;
            return (Aig_Obj_t *)(uVar9 ^ (ulong)pAVar10);
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs one retiming step forward.]

  Description [Returns the pointer to the register output after retiming.]
               
  SideEffects [Remember to run Aig_ManSetCioIds() in advance.]

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Saig_ManRetimeNodeFwd( Aig_Man_t * p, Aig_Obj_t * pObj, int fMakeBug )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Aig_Obj_t * pInput0, * pInput1;
    Aig_Obj_t * pObjNew, * pObjLi, * pObjLo;
    int fCompl;

    assert( Saig_ManRegNum(p) > 0 );
    assert( Aig_ObjIsNode(pObj) );

    // get the fanins
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
    // skip of they are not primary inputs
    if ( !Aig_ObjIsCi(pFanin0) || !Aig_ObjIsCi(pFanin1) )
        return NULL;

    // skip of they are not register outputs
    if ( !Saig_ObjIsLo(p, pFanin0) || !Saig_ObjIsLo(p, pFanin1) )
        return NULL;
    assert( Aig_ObjCioId(pFanin0) > 0 );
    assert( Aig_ObjCioId(pFanin1) > 0 );

    // skip latch guns
    if ( !Aig_ObjIsTravIdCurrent(p, pFanin0) && !Aig_ObjIsTravIdCurrent(p, pFanin1) )
        return NULL;

    // get the inputs of these registers
    pInput0 = Saig_ManLi( p, Aig_ObjCioId(pFanin0) - Saig_ManPiNum(p) );
    pInput1 = Saig_ManLi( p, Aig_ObjCioId(pFanin1) - Saig_ManPiNum(p) );
    pInput0 = Aig_ObjChild0( pInput0 );
    pInput1 = Aig_ObjChild0( pInput1 );
    pInput0 = Aig_NotCond( pInput0, Aig_ObjFaninC0(pObj) );
    pInput1 = Aig_NotCond( pInput1, Aig_ObjFaninC1(pObj) );
    // get the condition when the register should be complemetned
    fCompl = Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj);

    if ( fMakeBug )
    {
        printf( "Introducing bug during retiming.\n" );
        pInput1 = Aig_Not( pInput1 );
    }

    // create new node
    pObjNew = Aig_And( p, pInput0, pInput1 );

    // create new register input
    pObjLi = Aig_ObjCreateCo( p, Aig_NotCond(pObjNew, fCompl) );
    pObjLi->CioId = Aig_ManCoNum(p) - 1;

    // create new register output
    pObjLo = Aig_ObjCreateCi( p );
    pObjLo->CioId = Aig_ManCiNum(p) - 1;
    p->nRegs++;

    // make sure the register is retimable.
    Aig_ObjSetTravIdCurrent(p, pObjLo);

//printf( "Reg = %4d. Reg = %4d. Compl = %d. Phase = %d.\n", 
//       pFanin0->PioNum, pFanin1->PioNum, Aig_IsComplement(pObjNew), fCompl );

    // return register output
    return Aig_NotCond( pObjLo, fCompl );
}